

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v3.cpp
# Opt level: O0

void __thiscall
LASwriteItemCompressed_WAVEPACKET14_v3::~LASwriteItemCompressed_WAVEPACKET14_v3
          (LASwriteItemCompressed_WAVEPACKET14_v3 *this)

{
  IntegerCompressor *pIVar1;
  ArithmeticEncoder *this_00;
  uint local_14;
  U32 c;
  LASwriteItemCompressed_WAVEPACKET14_v3 *this_local;
  
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_001b0f20;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    if (this->contexts[local_14].m_packet_index != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel
                (this->enc_wavepacket,this->contexts[local_14].m_packet_index);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_wavepacket,this->contexts[local_14].m_offset_diff[0]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_wavepacket,this->contexts[local_14].m_offset_diff[1]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_wavepacket,this->contexts[local_14].m_offset_diff[2]);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_wavepacket,this->contexts[local_14].m_offset_diff[3]);
      pIVar1 = this->contexts[local_14].ic_offset_diff;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
      pIVar1 = this->contexts[local_14].ic_packet_size;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
      pIVar1 = this->contexts[local_14].ic_return_point;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
      pIVar1 = this->contexts[local_14].ic_xyz;
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
        operator_delete(pIVar1);
      }
    }
  }
  if (this->outstream_wavepacket != (ByteStreamOutArray *)0x0) {
    if (this->outstream_wavepacket != (ByteStreamOutArray *)0x0) {
      (*(this->outstream_wavepacket->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    }
    this_00 = this->enc_wavepacket;
    if (this_00 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(this_00);
      operator_delete(this_00);
    }
  }
  LASwriteItemCompressed::~LASwriteItemCompressed(&this->super_LASwriteItemCompressed);
  return;
}

Assistant:

LASwriteItemCompressed_WAVEPACKET14_v3::~LASwriteItemCompressed_WAVEPACKET14_v3()
{
  /* destroy all initialized scanner channel contexts */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    if (contexts[c].m_packet_index)
    {
      enc_wavepacket->destroySymbolModel(contexts[c].m_packet_index);
      enc_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[0]);
      enc_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[1]);
      enc_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[2]);
      enc_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[3]);
      delete contexts[c].ic_offset_diff;
      delete contexts[c].ic_packet_size;
      delete contexts[c].ic_return_point;
      delete contexts[c].ic_xyz;
    }
  }

  /* destroy all outstreams and encoders */

  if (outstream_wavepacket)
  {
    delete outstream_wavepacket;

    delete enc_wavepacket;
  }
}